

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::alloc_chunk(ImChunkStream<ImGuiTableSettings> *this,size_t sz)

{
  int iVar1;
  char *__src;
  char *__dest;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (this->Buf).Size;
  uVar2 = (int)sz + 7U & 0xfffffffc;
  iVar3 = iVar1 + uVar2;
  iVar4 = (this->Buf).Capacity;
  if (iVar4 < iVar3) {
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar4 <= iVar3) {
      iVar4 = iVar3;
    }
    __dest = (char *)ImGui::MemAlloc((long)iVar4);
    __src = (this->Buf).Data;
    if (__src != (char *)0x0) {
      memcpy(__dest,__src,(long)(this->Buf).Size);
      ImGui::MemFree((this->Buf).Data);
    }
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = iVar4;
  }
  else {
    __dest = (this->Buf).Data;
  }
  (this->Buf).Size = iVar3;
  *(uint *)(__dest + iVar1) = uVar2;
  return (ImGuiTableSettings *)((long)(__dest + iVar1) + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }